

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::reallocateAndGrow
          (QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *old)

{
  undefined8 *puVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  ExtraStruct *pEVar4;
  qsizetype qVar5;
  PrivateShared *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ExtraStruct *pEVar10;
  ExtraStruct *pEVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)0x0 && where == GrowsAtEnd)
       && (pQVar2 = &this->d->super_QArrayData, pQVar2 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar12 = QArrayData::reallocateUnaligned
                        (pQVar2,this->ptr,0x28,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                         -0x3333333333333333,Grow);
    this->d = (Data *)auVar12._0_8_;
    this->ptr = (ExtraStruct *)auVar12._8_8_;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (ExtraStruct *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    pEVar4 = local_48.ptr;
    if (this->size != 0) {
      lVar9 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar9 != 0) && (0 < lVar9)) {
          pEVar11 = this->ptr;
          pEVar10 = pEVar11 + lVar9;
          do {
            *(Extra *)((long)(&pEVar4[local_48.size].value + -1) + 0x18) = pEVar11->type;
            ::QVariant::QVariant(&pEVar4[local_48.size].value,&pEVar11->value);
            local_48.size = local_48.size + 1;
            pEVar11 = pEVar11 + 1;
          } while (pEVar11 < pEVar10);
        }
      }
      else if ((lVar9 != 0) && (0 < lVar9)) {
        pEVar10 = this->ptr;
        pEVar4 = pEVar10 + lVar9;
        do {
          local_48.ptr[local_48.size].type = pEVar10->type;
          pPVar6 = (pEVar10->value).d.data.shared;
          uVar7 = *(undefined8 *)((long)&(pEVar10->value).d.data + 8);
          uVar8 = *(undefined8 *)&(pEVar10->value).d.field_0x18;
          puVar1 = (undefined8 *)((long)&local_48.ptr[local_48.size].value.d.data + 0x10);
          *puVar1 = *(undefined8 *)((long)&(pEVar10->value).d.data + 0x10);
          puVar1[1] = uVar8;
          local_48.ptr[local_48.size].value.d.data.shared = pPVar6;
          *(undefined8 *)((long)&local_48.ptr[local_48.size].value.d.data + 8) = uVar7;
          (pEVar10->value).d.data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(pEVar10->value).d.data + 8) = 0;
          *(undefined8 *)((long)&(pEVar10->value).d.data + 0x10) = 0;
          *(undefined8 *)&(pEVar10->value).d.field_0x18 = 2;
          pEVar10 = pEVar10 + 1;
          local_48.size = local_48.size + 1;
        } while (pEVar10 < pEVar4);
      }
    }
    pDVar3 = this->d;
    pEVar4 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    qVar5 = this->size;
    this->size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = pEVar4;
    local_48.size = qVar5;
    if (old != (QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pEVar4;
      local_48.size = old->size;
      old->size = qVar5;
    }
    ~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }